

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

int Spl_ManLutFanouts(Gia_Man_t *p,int iObj,Vec_Int_t *vFanouts,Vec_Bit_t *vMarksNo,
                     Vec_Bit_t *vMarksCIO)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Gia_ObjIsLut2(p,iObj);
  if (iVar1 != 0) {
    vFanouts->nSize = 0;
    iVar1 = 0;
    while( true ) {
      iVar2 = Gia_ObjFanoutNumId(p,iObj);
      if (iVar2 <= iVar1) break;
      iVar2 = Gia_ObjFanoutId(p,iObj,iVar1);
      Spl_ManLutFanouts_rec(p,iVar2,vFanouts,vMarksNo,vMarksCIO);
      iVar1 = iVar1 + 1;
    }
    for (iVar1 = 0; iVar1 < vFanouts->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(vFanouts,iVar1);
      Vec_BitWriteEntry(vMarksCIO,iVar2,0);
    }
    return vFanouts->nSize;
  }
  __assert_fail("Gia_ObjIsLut2(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                ,0x10f,
                "int Spl_ManLutFanouts(Gia_Man_t *, int, Vec_Int_t *, Vec_Bit_t *, Vec_Bit_t *)");
}

Assistant:

int Spl_ManLutFanouts( Gia_Man_t * p, int iObj, Vec_Int_t * vFanouts, Vec_Bit_t * vMarksNo, Vec_Bit_t * vMarksCIO )
{
    int i, iFanout;
    assert( Gia_ObjIsLut2(p, iObj) );
    Vec_IntClear( vFanouts );
    Gia_ObjForEachFanoutStaticId( p, iObj, iFanout, i )
        Spl_ManLutFanouts_rec( p, iFanout, vFanouts, vMarksNo, vMarksCIO );
    // clean up
    Vec_IntForEachEntry( vFanouts, iFanout, i )
        Vec_BitWriteEntry( vMarksCIO, iFanout, 0 );
    return Vec_IntSize(vFanouts);
}